

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> * __thiscall
despot::BaseTag::OppTransitionDistribution
          (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
           *__return_storage_ptr__,BaseTag *this,int state)

{
  Floor *pFVar1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  int *piVar9;
  int **ppiVar10;
  ulong uVar11;
  int iVar12;
  mapped_type mVar13;
  Coord opp;
  int index;
  undefined8 local_50;
  int local_44 [2];
  Coord local_3c [8];
  int local_34;
  
  pFVar1 = &this->floor_;
  uVar5 = despot::Floor::GetCell((int)pFVar1);
  local_50 = despot::Floor::GetCell((int)pFVar1);
  p_Var2 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar12 = (int)uVar5;
  if ((int)local_50 == iVar12) {
    despot::Coord::Coord((Coord *)local_44,1,0);
    uVar6 = despot::operator+((Coord *)&local_50,(Coord *)local_44);
    cVar3 = despot::Floor::Inside(pFVar1,uVar6);
    if (cVar3 == '\0') {
      uVar7 = (ulong)(int)local_50;
      piVar9 = (int *)&Floor::INVALID;
      if (-1 < (long)uVar7) {
        uVar11 = (ulong)local_50._4_4_;
        if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
           ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
          ppiVar10 = (this->floor_).floor_;
          goto LAB_0010f9ea;
        }
      }
    }
    else {
      despot::Coord::Coord(local_3c,1,0);
      uVar7 = despot::operator+((Coord *)&local_50,local_3c);
      piVar9 = (int *)&Floor::INVALID;
      uVar4 = (uint)uVar7;
      if ((((-1 < (int)uVar4) && (-1 < (long)uVar7)) && ((int)uVar4 < (this->floor_).num_cols_)) &&
         (uVar11 = uVar7 >> 0x20, (int)(uVar7 >> 0x20) < (this->floor_).num_rows_)) {
        ppiVar10 = (this->floor_).floor_;
        uVar7 = (ulong)(uVar4 & 0x7fffffff);
LAB_0010f9ea:
        piVar9 = ppiVar10[uVar11] + uVar7;
      }
    }
    local_34 = *piVar9;
    pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_34);
    *pmVar8 = *pmVar8 + 0.2;
    despot::Coord::Coord((Coord *)local_44,-1,0);
    uVar6 = despot::operator+((Coord *)&local_50,(Coord *)local_44);
    cVar3 = despot::Floor::Inside(pFVar1,uVar6);
    if (cVar3 == '\0') {
      uVar7 = (ulong)(int)local_50;
      piVar9 = (int *)&Floor::INVALID;
      if (-1 < (long)uVar7) {
        uVar11 = (ulong)local_50._4_4_;
        if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
           ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
          ppiVar10 = (this->floor_).floor_;
          goto LAB_0010fb23;
        }
      }
    }
    else {
      despot::Coord::Coord(local_3c,-1,0);
      uVar7 = despot::operator+((Coord *)&local_50,local_3c);
      piVar9 = (int *)&Floor::INVALID;
      uVar4 = (uint)uVar7;
      if (((-1 < (int)uVar4) && (-1 < (long)uVar7)) &&
         (((int)uVar4 < (this->floor_).num_cols_ &&
          (uVar11 = uVar7 >> 0x20, (int)(uVar7 >> 0x20) < (this->floor_).num_rows_)))) {
        ppiVar10 = (this->floor_).floor_;
        uVar7 = (ulong)(uVar4 & 0x7fffffff);
LAB_0010fb23:
        piVar9 = ppiVar10[uVar11] + uVar7;
      }
    }
    local_34 = *piVar9;
    pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_34);
    mVar13 = *pmVar8 + 0.2;
  }
  else {
    iVar12 = ((iVar12 < (int)local_50) - 1) + (uint)(iVar12 < (int)local_50);
    despot::Coord::Coord((Coord *)local_44,iVar12,0);
    uVar6 = despot::operator+((Coord *)&local_50,(Coord *)local_44);
    cVar3 = despot::Floor::Inside(pFVar1,uVar6);
    if (cVar3 == '\0') {
      uVar7 = (ulong)(int)local_50;
      piVar9 = (int *)&Floor::INVALID;
      if (-1 < (long)uVar7) {
        uVar11 = (ulong)local_50._4_4_;
        if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
           ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
          ppiVar10 = (this->floor_).floor_;
          goto LAB_0010fad0;
        }
      }
    }
    else {
      despot::Coord::Coord(local_3c,iVar12,0);
      uVar7 = despot::operator+((Coord *)&local_50,local_3c);
      piVar9 = (int *)&Floor::INVALID;
      uVar4 = (uint)uVar7;
      if (((-1 < (int)uVar4) && (-1 < (long)uVar7)) &&
         (((int)uVar4 < (this->floor_).num_cols_ &&
          (uVar11 = uVar7 >> 0x20, (int)(uVar7 >> 0x20) < (this->floor_).num_rows_)))) {
        ppiVar10 = (this->floor_).floor_;
        uVar7 = (ulong)(uVar4 & 0x7fffffff);
LAB_0010fad0:
        piVar9 = ppiVar10[uVar11] + uVar7;
      }
    }
    local_34 = *piVar9;
    pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_34);
    mVar13 = *pmVar8 + 0.4;
  }
  *pmVar8 = mVar13;
  iVar12 = (int)((ulong)uVar5 >> 0x20);
  if (local_50._4_4_ != iVar12) {
    iVar12 = (uint)(iVar12 < (int)local_50._4_4_) * 2 + -1;
    despot::Coord::Coord((Coord *)local_44,0,iVar12);
    despot::operator+((Coord *)&local_50,(Coord *)local_44);
    cVar3 = despot::Floor::Inside(pFVar1);
    if (cVar3 == '\0') {
      uVar7 = (ulong)(int)local_50;
      piVar9 = (int *)&Floor::INVALID;
      if (-1 < (long)uVar7) {
        uVar11 = (ulong)local_50._4_4_;
        if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
           ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
          ppiVar10 = (this->floor_).floor_;
          goto LAB_0010fd9c;
        }
      }
    }
    else {
      despot::Coord::Coord(local_3c,0,iVar12);
      uVar7 = despot::operator+((Coord *)&local_50,local_3c);
      piVar9 = (int *)&Floor::INVALID;
      uVar4 = (uint)uVar7;
      if (((-1 < (int)uVar4) && (-1 < (long)uVar7)) &&
         (((int)uVar4 < (this->floor_).num_cols_ &&
          (uVar11 = uVar7 >> 0x20, (int)(uVar7 >> 0x20) < (this->floor_).num_rows_)))) {
        ppiVar10 = (this->floor_).floor_;
        uVar7 = (ulong)(uVar4 & 0x7fffffff);
LAB_0010fd9c:
        piVar9 = ppiVar10[uVar11] + uVar7;
      }
    }
    local_34 = *piVar9;
    pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](__return_storage_ptr__,&local_34);
    mVar13 = *pmVar8 + 0.4;
    goto LAB_0010fe17;
  }
  despot::Coord::Coord((Coord *)local_44,0,1);
  despot::operator+((Coord *)&local_50,(Coord *)local_44);
  cVar3 = despot::Floor::Inside(pFVar1);
  if (cVar3 == '\0') {
    uVar7 = (ulong)(int)local_50;
    piVar9 = (int *)&Floor::INVALID;
    if (-1 < (long)uVar7) {
      uVar11 = (ulong)local_50._4_4_;
      if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
         ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
        ppiVar10 = (this->floor_).floor_;
        goto LAB_0010fcb6;
      }
    }
  }
  else {
    despot::Coord::Coord(local_3c,0,1);
    uVar7 = despot::operator+((Coord *)&local_50,local_3c);
    piVar9 = (int *)&Floor::INVALID;
    uVar4 = (uint)uVar7;
    if ((((-1 < (int)uVar4) && (-1 < (long)uVar7)) && ((int)uVar4 < (this->floor_).num_cols_)) &&
       (uVar11 = uVar7 >> 0x20, (int)(uVar7 >> 0x20) < (this->floor_).num_rows_)) {
      ppiVar10 = (this->floor_).floor_;
      uVar7 = (ulong)(uVar4 & 0x7fffffff);
LAB_0010fcb6:
      piVar9 = ppiVar10[uVar11] + uVar7;
    }
  }
  local_34 = *piVar9;
  pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](__return_storage_ptr__,&local_34);
  *pmVar8 = *pmVar8 + 0.2;
  despot::Coord::Coord((Coord *)local_44,0,-1);
  despot::operator+((Coord *)&local_50,(Coord *)local_44);
  cVar3 = despot::Floor::Inside(pFVar1);
  if (cVar3 == '\0') {
    uVar7 = (ulong)(int)local_50;
    piVar9 = (int *)&Floor::INVALID;
    if (-1 < (long)uVar7) {
      uVar11 = (ulong)local_50._4_4_;
      if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
         ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
        ppiVar10 = (this->floor_).floor_;
        goto LAB_0010fdef;
      }
    }
  }
  else {
    despot::Coord::Coord(local_3c,0,-1);
    uVar7 = despot::operator+((Coord *)&local_50,local_3c);
    piVar9 = (int *)&Floor::INVALID;
    uVar4 = (uint)uVar7;
    if (((-1 < (int)uVar4) && (-1 < (long)uVar7)) &&
       (((int)uVar4 < (this->floor_).num_cols_ &&
        (uVar11 = uVar7 >> 0x20, (int)(uVar7 >> 0x20) < (this->floor_).num_rows_)))) {
      ppiVar10 = (this->floor_).floor_;
      uVar7 = (ulong)(uVar4 & 0x7fffffff);
LAB_0010fdef:
      piVar9 = ppiVar10[uVar11] + uVar7;
    }
  }
  local_34 = *piVar9;
  pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](__return_storage_ptr__,&local_34);
  mVar13 = *pmVar8 + 0.2;
LAB_0010fe17:
  *pmVar8 = mVar13;
  piVar9 = (int *)&Floor::INVALID;
  if (-1 < (long)(int)local_50) {
    if (((-1 < local_50) && ((int)local_50 < (this->floor_).num_cols_)) &&
       ((int)local_50._4_4_ < (this->floor_).num_rows_)) {
      piVar9 = (this->floor_).floor_[local_50._4_4_] + (int)local_50;
    }
  }
  local_44[0] = *piVar9;
  pmVar8 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
           operator[](__return_storage_ptr__,local_44);
  *pmVar8 = *pmVar8 + 0.2;
  return __return_storage_ptr__;
}

Assistant:

map<int, double> BaseTag::OppTransitionDistribution(int state) const {
	Coord rob = floor_.GetCell(rob_[state]), opp = floor_.GetCell(opp_[state]);

	map<int, double> distribution;

	if (opp.x == rob.x) {
		int index =
			floor_.Inside(opp + Coord(1, 0)) ?
				floor_.GetIndex(opp + Coord(1, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;

		index =
			floor_.Inside(opp + Coord(-1, 0)) ?
				floor_.GetIndex(opp + Coord(-1, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;
	} else {
		int dx = opp.x > rob.x ? 1 : -1;
		int index =
			floor_.Inside(opp + Coord(dx, 0)) ?
				floor_.GetIndex(opp + Coord(dx, 0)) : floor_.GetIndex(opp);
		distribution[index] += 0.4;
	}

	if (opp.y == rob.y) {
		int index =
			floor_.Inside(opp + Coord(0, 1)) ?
				floor_.GetIndex(opp + Coord(0, 1)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;

		index =
			floor_.Inside(opp + Coord(0, -1)) ?
				floor_.GetIndex(opp + Coord(0, -1)) : floor_.GetIndex(opp);
		distribution[index] += 0.2;
	} else {
		int dy = opp.y > rob.y ? 1 : -1;
		int index =
			floor_.Inside(opp + Coord(0, dy)) ?
				floor_.GetIndex(opp + Coord(0, dy)) : floor_.GetIndex(opp);
		distribution[index] += 0.4;
	}

	distribution[floor_.GetIndex(opp)] += 0.2;

	return distribution;
}